

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_coder.cpp
# Opt level: O0

void __thiscall basic_coder::basic_coder(basic_coder *this,string *src,string *dst,size_t buf_sz)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  runtime_error *prVar3;
  unique_ptr<tree,_std::default_delete<tree>_> *this_00;
  undefined8 in_RCX;
  string *in_RDX;
  string *in_RSI;
  void *in_RDI;
  pointer in_stack_ffffffffffffff58;
  unique_ptr<tree,_std::default_delete<tree>_> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffffc0;
  
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(in_RDI,in_RSI,_Var2);
  _Var2 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream((void *)((long)in_RDI + 0x208),in_RDX,_Var2);
  *(undefined8 *)((long)in_RDI + 0x408) = in_RCX;
  std::unique_ptr<tree,std::default_delete<tree>>::unique_ptr<std::default_delete<tree>,void>
            (in_stack_ffffffffffffff60);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Source file doesn\'t exist");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Destination file name is invalid");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (unique_ptr<tree,_std::default_delete<tree>_> *)operator_new(0x70);
  tree::tree((tree *)CONCAT44(_Var2,in_stack_ffffffffffffffc0));
  std::unique_ptr<tree,std::default_delete<tree>>::unique_ptr<std::default_delete<tree>,void>
            (this_00,in_stack_ffffffffffffff58);
  std::unique_ptr<tree,_std::default_delete<tree>_>::operator=
            (this_00,(unique_ptr<tree,_std::default_delete<tree>_> *)in_stack_ffffffffffffff58);
  std::unique_ptr<tree,_std::default_delete<tree>_>::~unique_ptr(this_00);
  return;
}

Assistant:

basic_coder::basic_coder(const std::string &src, const std::string &dst, size_t buf_sz) :
        src_file(src, std::ios::in | std::ios::binary),
        dst_file(dst, std::ios::out | std::ios::binary),
        buffer_size(buf_sz) {
    if (!src_file.is_open())
        throw std::runtime_error("Source file doesn't exist");
    if (!dst_file.is_open())
        throw std::runtime_error("Destination file name is invalid");
    h_tree = std::unique_ptr<tree>(new tree());
}